

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_merge_to_ctx(lyd_node **trg,lyd_node *src,int options,ly_ctx *ctx)

{
  lyd_node **pplVar1;
  ly_ctx *plVar2;
  bool bVar3;
  int iVar4;
  LY_ERR *pLVar5;
  lys_node *plVar6;
  lyd_node *node;
  lys_node *plVar7;
  lyd_node *plVar8;
  char *pcVar9;
  lyd_node *plVar10;
  int iVar11;
  lyd_node *plVar12;
  lyd_node *plVar13;
  int iVar14;
  ly_ctx *ctx_00;
  lyd_node *local_78;
  lyd_node *local_70;
  lys_node *local_60;
  uint local_38;
  
  pLVar5 = ly_errno_location();
  *pLVar5 = LY_SUCCESS;
  if ((trg == (lyd_node **)0x0) || (node = *trg, src == (lyd_node *)0x0 || node == (lyd_node *)0x0))
  {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EINVAL;
    return -1;
  }
  plVar6 = node->schema;
  while (plVar6 = lys_parent(plVar6), plVar6 != (lys_node *)0x0) {
    if (plVar6->nodetype != LYS_USES) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINVAL;
      ly_log(LY_LLERR,"Target not a top-level data tree.");
      return -1;
    }
  }
  plVar2 = node->schema->module->ctx;
  if ((ctx == (ly_ctx *)0x0) || (plVar2 == ctx)) {
    ctx_00 = plVar2;
    if ((src->schema->module->ctx == plVar2) && (ctx_00 = ctx, plVar2 == ctx)) {
      ctx_00 = (ly_ctx *)0x0;
    }
  }
  else {
    do {
      plVar8 = node;
      node = plVar8->prev;
    } while (plVar8->prev->next != (lyd_node *)0x0);
    *trg = plVar8;
    plVar12 = (lyd_node *)0x0;
    do {
      node = lyd_dup_to_ctx(plVar8,1,ctx);
      if ((node == (lyd_node *)0x0) ||
         ((plVar12 != (lyd_node *)0x0 &&
          (iVar4 = lyd_insert_after(plVar12->prev,node), node = plVar12, iVar4 != 0)))) {
        plVar12 = (lyd_node *)0x0;
        node = plVar8;
        goto LAB_0015d3a2;
      }
      plVar8 = plVar8->next;
      plVar12 = node;
      ctx_00 = ctx;
    } while (plVar8 != (lyd_node *)0x0);
  }
  plVar6 = src->schema;
  plVar7 = lys_parent(plVar6);
  bVar3 = true;
  iVar4 = 0;
  iVar14 = 0;
  local_38 = 1;
  if (plVar7 != (lys_node *)0x0) {
    iVar14 = 0;
    do {
      plVar6 = lys_parent(plVar6);
      iVar14 = iVar14 + 1;
      plVar7 = lys_parent(plVar6);
    } while (plVar7 != (lys_node *)0x0);
    plVar8 = src;
    if (((uint)options >> 0xc & 1) == 0) {
      do {
        if ((plVar8->field_0x9 & 1) == 0) {
          local_38 = 0;
          goto LAB_0015d0fd;
        }
        pplVar1 = &plVar8->next;
        plVar8 = *pplVar1;
      } while (*pplVar1 != (lyd_node *)0x0);
      local_38 = 1;
    }
    else {
      local_38 = (byte)src->field_0x9 & 1;
    }
  }
LAB_0015d0fd:
  local_70 = (lyd_node *)0x0;
  local_60 = (lys_node *)0x0;
  local_78 = node;
  plVar8 = (lyd_node *)0x0;
  do {
    plVar12 = plVar8;
    plVar6 = src->schema;
    do {
      if (iVar14 <= iVar4) {
LAB_0015d277:
        if (((uint)options >> 10 & 1) != 0) {
          plVar8 = src->prev;
          if (((uint)options >> 0xc & 1) != 0 && plVar8 != src) {
            lyd_unlink_internal(src,1);
            lyd_free_withsiblings(plVar8);
          }
          goto LAB_0015d313;
        }
        plVar13 = (lyd_node *)0x0;
        plVar8 = src;
        goto LAB_0015d290;
      }
      iVar11 = 0;
      plVar7 = plVar6;
      do {
        plVar7 = lys_parent(plVar7);
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar14 - iVar4);
      plVar6 = src->schema;
      if (plVar7 == plVar6) goto LAB_0015d277;
      iVar4 = iVar4 + 1;
    } while ((plVar7->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN);
    if (plVar7->nodetype != LYS_CONTAINER) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINVAL;
      pcVar9 = strnodetype(plVar7->nodetype);
      ly_log(LY_LLERR,"Cannot create %s \"%s\" for the merge.",pcVar9,plVar7->name);
      break;
    }
    if (plVar12 == (lyd_node *)0x0) {
      local_70 = local_78;
      if (!bVar3) {
        local_70 = local_78->child;
      }
      for (; local_70 != (lyd_node *)0x0; local_70 = local_70->next) {
        local_60 = plVar7;
        if ((ctx_00 != (ly_ctx *)0x0) &&
           (local_60 = lys_get_schema_inctx(plVar7,ctx_00), local_60 == (lys_node *)0x0)) {
          pLVar5 = ly_errno_location();
          *pLVar5 = LY_EINVAL;
          plVar12 = (lyd_node *)0x0;
          ly_log(LY_LLERR,
                 "Target context does not contain schema node for the data node being merged (%s:%s)."
                 ,plVar7->module->name,plVar7->name);
          goto LAB_0015d3a2;
        }
        plVar8 = local_70;
        if (local_70->schema == local_60) goto LAB_0015d211;
      }
      local_70 = (lyd_node *)0x0;
      plVar8 = local_78;
LAB_0015d211:
      local_78 = plVar8;
      if (((uint)options >> 10 & 1) == 0) {
        plVar7 = local_60;
      }
      bVar3 = false;
    }
    else if ((((uint)options >> 10 & 1) == 0 && ctx_00 != (ly_ctx *)0x0) &&
            (plVar7 = lys_get_schema_inctx(plVar7,ctx_00), plVar7 == (lys_node *)0x0)) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EINVAL;
      ly_log(LY_LLERR,
             "Target context does not contain schema node for the data node being merged (%s:%s).",
             *(undefined8 *)(_DAT_00000030 + 8));
      break;
    }
    plVar8 = plVar12;
  } while (((local_70 != (lyd_node *)0x0) ||
           (plVar8 = _lyd_new((lyd_node *)0x0,plVar7,local_38), plVar12 == (lyd_node *)0x0)) ||
          (iVar11 = lyd_insert(plVar8,plVar12), iVar11 == 0));
  goto LAB_0015d3a2;
  while ((((uint)options >> 0xc & 1) == 0 &&
         (plVar8 = plVar8->next, plVar13 = src, plVar8 != (lyd_node *)0x0))) {
LAB_0015d290:
    src = lyd_dup_to_ctx(plVar8,1,ctx_00);
    if ((src == (lyd_node *)0x0) ||
       ((plVar13 != (lyd_node *)0x0 &&
        (iVar4 = lyd_insert_after(plVar13->prev,src), src = plVar13, iVar4 != 0)))) {
      lyd_free_withsiblings(plVar13);
      goto LAB_0015d3a2;
    }
  }
LAB_0015d313:
  plVar8 = plVar12;
  plVar13 = src;
  if (plVar12 != (lyd_node *)0x0) {
    do {
      plVar10 = plVar8;
      plVar8 = plVar10->child;
    } while (plVar10->child != (lyd_node *)0x0);
    plVar10->child = src;
    do {
      src->parent = plVar10;
      src = src->next;
      plVar13 = plVar12;
    } while (src != (lyd_node *)0x0);
  }
  plVar12 = plVar13;
  if (bVar3) {
    iVar4 = lyd_merge_siblings(local_78,plVar12,options);
  }
  else {
    iVar4 = lyd_merge_parent_children(local_78,plVar12,options);
  }
  if (iVar4 == 0) {
    if (node->schema->nodetype == LYS_RPC) {
      lyd_schema_sort(node,1);
    }
    if (*trg != node) {
      lyd_free_withsiblings(*trg);
      *trg = node;
      return 0;
    }
    return 0;
  }
LAB_0015d3a2:
  if (*trg != node) {
    lyd_free_withsiblings(node);
  }
  lyd_free_withsiblings(plVar12);
  return -1;
}

Assistant:

API int
lyd_merge_to_ctx(struct lyd_node **trg, const struct lyd_node *src, int options, struct ly_ctx *ctx)
{
    struct lyd_node *node = NULL, *node2, *target, *trg_merge_start, *src_merge_start = NULL;
    const struct lyd_node *iter;
    struct lys_node *src_snode, *sch = NULL;
    int i, src_depth, depth, first_iter, ret, dflt = 1;
    const struct lys_node *parent = NULL;

    /* initialize errno */
    ly_errno = LY_SUCCESS;

    if (!trg || !(*trg) || !src) {
        ly_errno = LY_EINVAL;
        return -1;
    }
    target = *trg;

    parent = lys_parent(target->schema);

    /* go up all uses */
    while (parent && (parent->nodetype == LYS_USES)) {
        parent = lys_parent(parent);
    }

    if (parent) {
        LOGERR(LY_EINVAL, "Target not a top-level data tree.");
        return -1;
    }

    /* get know if we are converting data into a different context */
    if (ctx && target->schema->module->ctx != ctx) {
        /* target's data tree context differs from the target context, move the target
         * data tree into the target context */

        /* get the first target's top-level and store it as the result */
        for (; target->prev->next; target = target->prev);
        *trg = target;

        for (node = NULL, trg_merge_start = target; target; target = target->next) {
            node2 = lyd_dup_to_ctx(target, 1, ctx);
            if (!node2) {
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    goto error;
                }
            } else {
                node = node2;
            }
        }
        target = node;
        node = NULL;
    } else if (src->schema->module->ctx != target->schema->module->ctx) {
        /* the source data will be converted into the target's context during the merge */
        ctx = target->schema->module->ctx;
    } else if (ctx == src->schema->module->ctx) {
        /* no conversion is needed */
        ctx = NULL;
    }

    /* find source top-level schema node */
    for (src_snode = src->schema, src_depth = 0;
         lys_parent(src_snode);
         src_snode = lys_parent(src_snode), ++src_depth);

    /* find first shared missing schema parent of the subtrees */
    trg_merge_start = target;
    depth = 0;
    first_iter = 1;
    if (src_depth) {
        /* we are going to create missing parents in the following loop,
         * but we will need to know a dflt flag for them. In case the newly
         * created parent is going to have at least one non-default child,
         * it will be also non-default, otherwise it will be the default node */
        if (options & LYD_OPT_NOSIBLINGS) {
            dflt = src->dflt;
        } else {
            LY_TREE_FOR(src, iter) {
                if (!iter->dflt) {
                    /* non default sibling -> parent is going to be
                     * created also as non-default */
                    dflt = 0;
                    break;
                }
            }
        }
    }
    while (1) {
        /* going from down (source root) to up (top-level or the common node with target */
        do {
            for (src_snode = src->schema, i = 0; i < src_depth - depth; src_snode = lys_parent(src_snode), ++i);
            ++depth;
        } while (src_snode != src->schema && (src_snode->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES)));

        if (src_snode == src->schema) {
            break;
        }

        if (src_snode->nodetype != LYS_CONTAINER) {
            /* we would have to create a list (the only data node with children except container), impossible */
            LOGERR(LY_EINVAL, "Cannot create %s \"%s\" for the merge.", strnodetype(src_snode->nodetype), src_snode->name);
            goto error;
        }

        /* have we created any missing containers already? if we did,
         * it is totally useless to search for match, there won't ever be */
        if (!src_merge_start) {
            if (first_iter) {
                node = trg_merge_start;
                first_iter = 0;
            } else {
                node = trg_merge_start->child;
            }

            /* find it in target data nodes */
            LY_TREE_FOR(node, node) {
                if (ctx) {
                    /* we have the schema nodes in the different context */
                    sch = lys_get_schema_inctx(src_snode, ctx);
                    if (!sch) {
                        LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being "
                               "merged (%s:%s).", src_snode->module->name, src_snode->name);
                        goto error;
                    }
                } else {
                    /* the context is same and comparison of the schema nodes will works fine */
                    sch = src_snode;
                }

                if (node->schema == sch) {
                    trg_merge_start = node;
                    break;
                }
            }

            if (!(options & LYD_OPT_DESTRUCT)) {
                /* the source tree will be duplicated, so to save some work in case
                 * of different target context, create also the parents nodes in the
                 * correct context */
                src_snode = sch;
            }
        } else if (ctx && !(options & LYD_OPT_DESTRUCT)) {
            /* get the schema node in the correct (target) context, same as above,
             * this is done to save some work and have the source in the same context
             * when the provided source tree is below duplicated in the target context
             * and connected into the parents created here */
            src_snode = lys_get_schema_inctx(src_snode, ctx);
            if (!src_snode) {
                LOGERR(LY_EINVAL, "Target context does not contain schema node for the data node being "
                       "merged (%s:%s).", src_snode->module->name, src_snode->name);
                goto error;
            }
        }

        if (!node) {
            /* it is not there, create it */
            node2 = _lyd_new(NULL, src_snode, dflt);
            if (!src_merge_start) {
                src_merge_start = node2;
            } else {
                if (lyd_insert(node2, src_merge_start)) {
                    goto error;
                }
                src_merge_start = node2;
            }
        }
    }

    /* process source according to options */
    if (options & LYD_OPT_DESTRUCT) {
        node = (struct lyd_node *)src;
        if ((node->prev != node) && (options & LYD_OPT_NOSIBLINGS)) {
            node2 = node->prev;
            lyd_unlink(node);
            lyd_free_withsiblings(node2);
        }
    } else {
        node = NULL;
        for (; src; src = src->next) {
            /* because we already have to duplicate it, do it in the correct context */
            node2 = lyd_dup_to_ctx(src, 1, ctx);
            if (!node2) {
                lyd_free_withsiblings(node);
                goto error;
            }
            if (node) {
                if (lyd_insert_after(node->prev, node2)) {
                    lyd_free_withsiblings(node);
                    goto error;
                }
            } else {
                node = node2;
            }

            if (options & LYD_OPT_NOSIBLINGS) {
                break;
            }
        }
    }

    if (src_merge_start) {
        /* insert data into the created parents */
        /* first, get the lowest created parent, we don't have to check the nodetype since we are
         * creating only a simple chain of containers */
        for (node2 = src_merge_start; node2->child; node2 = node2->child);
        node2->child = node;
        LY_TREE_FOR(node, node) {
            node->parent = node2;
        }
    } else {
        src_merge_start = node;
    }

    if (!first_iter) {
        /* !! src_merge start is a child(ren) of trg_merge_start */
        ret = lyd_merge_parent_children(trg_merge_start, src_merge_start, options);
    } else {
        /* !! src_merge start is a (top-level) sibling(s) of trg_merge_start */
        ret = lyd_merge_siblings(trg_merge_start, src_merge_start, options);
    }
    if (ret) {
        goto error;
    }

    if (target->schema->nodetype == LYS_RPC) {
        lyd_schema_sort(target, 1);
    }

    /* update the pointer to the target tree if needed */
    if (*trg != target) {
        lyd_free_withsiblings(*trg);
        (*trg) = target;
    }
    return ret;

error:
    if (*trg != target) {
        /* target is duplication of the original target in different context,
         * free it due to the error */
        lyd_free_withsiblings(target);
    }
    lyd_free_withsiblings(src_merge_start);
    return -1;
}